

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

int UnicodeDataComp(void *pnKey,void *elem)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((int)(uint)*elem <= (int)*pnKey) {
    uVar1 = (uint)((uint)*(ushort *)((long)elem + 6) + (uint)*elem < *pnKey);
  }
  return uVar1;
}

Assistant:

static int UnicodeDataComp(const void *pnKey, const void *elem)
{
    WCHAR uValue = ((UnicodeDataRec*)elem)->nUnicodeValue;
    WORD  rangeValue = ((UnicodeDataRec*)elem)->rangeValue;

    if (*((INT*)pnKey) < uValue)
    {
        return -1;
    }
    else
    {
        if (*((INT*)pnKey) > (uValue + rangeValue))
        {
            return 1;
        }
        else
        {
            return 0;
        }
    }
}